

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O3

void Gia_Sim2Delete(Gia_Sim2_t *p)

{
  Vec_Int_t *pVVar1;
  
  pVVar1 = p->vClassOld;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vClassOld->pArray = (int *)0x0;
      pVVar1 = p->vClassOld;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0071ee70;
    }
    free(pVVar1);
    p->vClassOld = (Vec_Int_t *)0x0;
  }
LAB_0071ee70:
  pVVar1 = p->vClassNew;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vClassNew->pArray = (int *)0x0;
      pVVar1 = p->vClassNew;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0071eeac;
    }
    free(pVVar1);
    p->vClassNew = (Vec_Int_t *)0x0;
  }
LAB_0071eeac:
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
  }
  free(p);
  return;
}

Assistant:

void Gia_Sim2Delete( Gia_Sim2_t * p )
{
    Vec_IntFreeP( &p->vClassOld );
    Vec_IntFreeP( &p->vClassNew );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p );
}